

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProtocEditionsSupport
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  Edition EVar1;
  bool bVar2;
  Edition EVar3;
  reference ppFVar4;
  string_view filename;
  string_view format;
  Arg *a2;
  undefined1 local_188 [44];
  Edition local_15c;
  Arg local_158;
  string local_118;
  Arg local_f8;
  string_view local_c8;
  Arg local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string local_78;
  string_view local_58;
  Edition local_44;
  FileDescriptor *pFStack_40;
  Edition edition;
  FileDescriptor *fd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  if ((this->experimental_editions_ & 1U) == 0) {
    __end2 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(parsed_files);
    fd = (FileDescriptor *)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end(parsed_files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                       *)&fd), bVar2) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                ::operator*(&__end2);
      pFStack_40 = *ppFVar4;
      local_44 = protobuf::internal::InternalFeatureHelper::GetEdition(pFStack_40);
      local_58 = FileDescriptor::name(pFStack_40);
      filename._M_str = local_58._M_str;
      filename._M_len = (size_t)filename._M_str;
      bVar2 = CanSkipEditionCheck((compiler *)local_58._M_len,filename);
      EVar1 = local_44;
      if ((!bVar2) && (EVar3 = ProtocMaximumEdition(), (int)EVar3 < (int)EVar1)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,
                   "$0: is a file using edition $1, which is later than the protoc maximum supported edition $2."
                  );
        local_c8 = FileDescriptor::name(pFStack_40);
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_b8,local_c8);
        local_118.field_2._M_allocated_capacity = 0;
        local_118.field_2._8_8_ = 0;
        local_118._M_dataplus = (_Alloc_hider)0x0;
        local_118._1_7_ = 0;
        local_118._M_string_length = 0;
        absl::lts_20250127::strings_internal::StringifySink::StringifySink
                  ((StringifySink *)&local_118);
        absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
                  (&local_f8,&local_44,(StringifySink *)&local_118);
        local_15c = ProtocMaximumEdition();
        local_188._16_8_ = 0;
        local_188[0x18] = '\0';
        local_188[0x19] = '\0';
        local_188[0x1a] = '\0';
        local_188[0x1b] = '\0';
        local_188[0x1c] = '\0';
        local_188[0x1d] = '\0';
        local_188[0x1e] = '\0';
        local_188[0x1f] = '\0';
        local_188._0_8_ = 0;
        local_188._8_8_ = (char *)0x0;
        a2 = (Arg *)local_188;
        absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)a2);
        absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
                  (&local_158,&local_15c,(StringifySink *)a2);
        format._M_str = (char *)&local_b8;
        format._M_len = (size_t)local_88._M_str;
        absl::lts_20250127::Substitute_abi_cxx11_
                  (&local_78,(lts_20250127 *)local_88._M_len,format,&local_f8,&local_158,a2);
        std::operator<<((ostream *)&std::cerr,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                  ((StringifySink *)local_188);
        absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                  ((StringifySink *)&local_118);
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
      ::operator++(&__end2);
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceProtocEditionsSupport(
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if (edition > ProtocMaximumEdition()) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $1, which is later than the protoc "
          "maximum supported edition $2.",
          fd->name(), edition, ProtocMaximumEdition());
      return false;
    }
  }
  return true;
}